

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# processestimator.cxx
# Opt level: O0

Matrix * __thiscall
ProcessEstimator::getEstimate(Matrix *__return_storage_ptr__,ProcessEstimator *this,Property *p)

{
  int *u1;
  double dVar1;
  StochasticProcess *pSVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  Physical *local_24f0;
  Physical *local_24e0;
  double local_24a0;
  Matrix local_2480;
  Matrix local_2380;
  Matrix local_2280;
  Matrix local_2180;
  Matrix local_2080;
  Matrix local_1f80;
  uint local_1e80;
  uint local_1e7c;
  uint i_3;
  uint j;
  allocator<char> local_1dd9;
  string local_1dd8;
  undefined1 local_1db8 [8];
  Physical p_2;
  Physical local_1c88;
  Physical local_1bf0;
  string local_1b58;
  string local_1b38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1af8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1ad8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1ab8;
  allocator<char> local_1a91;
  string local_1a90;
  undefined1 local_1a70 [8];
  Graph a_3;
  Matrix local_1870;
  Matrix local_1770;
  Matrix local_1670;
  uint local_156c;
  undefined1 local_1568 [4];
  uint i_2;
  Physical local_14d0;
  Physical local_1438;
  string local_13a0;
  string local_1380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1300;
  Unit local_12e0;
  string local_1278;
  undefined1 local_1258 [8];
  Physical p_1;
  Unit unit;
  undefined1 local_10f0 [8];
  string name;
  string local_10c8;
  undefined1 local_10a8 [8];
  Graph a_2;
  Matrix local_ea8;
  Matrix local_da8;
  Matrix local_ca8;
  uint local_ba4;
  undefined1 local_ba0 [4];
  uint i_1;
  Physical local_b08;
  Physical local_a70;
  string local_9d8;
  string local_9b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_998;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_978;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_958;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_938;
  allocator<char> local_911;
  string local_910;
  undefined1 local_8f0 [8];
  Graph a_1;
  Matrix local_6f0;
  Matrix local_5f0;
  Matrix local_4f0;
  uint local_3ec;
  undefined1 local_3e8 [4];
  uint i;
  Physical local_350;
  Physical local_2b8;
  string local_220;
  string local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  allocator<char> local_149;
  string local_148;
  undefined1 local_128 [8];
  Graph a;
  double samples;
  Property *p_local;
  ProcessEstimator *this_local;
  
  if ((this->super_Estimator).nSamples == 0) {
    local_24a0 = 1.0;
  }
  else {
    local_24a0 = (double)(this->super_Estimator).nSamples;
  }
  a.super_Matrix.sMatrixName.field_2._8_8_ = local_24a0;
  if (((this->super_Estimator).nEstimate & 0x40U) != 0) {
    a.super_Matrix.sMatrixName.field_2._8_8_ =
         ((this->super_Estimator).estimatorTime)->dt * local_24a0;
  }
  if ((*p & (this->super_Estimator).nEstimate & 1U) == 0) {
    if ((*p & (this->super_Estimator).nEstimate & 4U) == 0) {
      if ((*p & (this->super_Estimator).nEstimate & 8U) == 0) {
        if ((*p & (this->super_Estimator).nEstimate & 2U) == 0) {
          Matrix::Matrix(__return_storage_ptr__);
        }
        else {
          Graph::Graph((Graph *)local_1a70,this->nLength,(int)this->nDist);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1a90,"process density",&local_1a91);
          Matrix::setName((Matrix *)local_1a70,&local_1a90);
          std::__cxx11::string::~string((string *)&local_1a90);
          std::allocator<char>::~allocator(&local_1a91);
          if ((this->super_Estimator).pSource != (StochasticProcess *)0x0) {
            Parametric::getName_abi_cxx11_
                      (&local_1b38,&((this->super_Estimator).pSource)->super_Parametric);
            std::operator+(&local_1b18,"density of ",&local_1b38);
            std::operator+(&local_1af8,&local_1b18," (");
            Parametric::getType_abi_cxx11_
                      (&local_1b58,&((this->super_Estimator).pSource)->super_Parametric);
            std::operator+(&local_1ad8,&local_1af8,&local_1b58);
            std::operator+(&local_1ab8,&local_1ad8,")");
            Matrix::setName((Matrix *)local_1a70,&local_1ab8);
            std::__cxx11::string::~string((string *)&local_1ab8);
            std::__cxx11::string::~string((string *)&local_1ad8);
            std::__cxx11::string::~string((string *)&local_1b58);
            std::__cxx11::string::~string((string *)&local_1af8);
            std::__cxx11::string::~string((string *)&local_1b18);
            std::__cxx11::string::~string((string *)&local_1b38);
            Physical::Physical(&local_1bf0,&((this->super_Estimator).pSource)->super_Physical);
            Matrix::setPhysical((Matrix *)local_1a70,&local_1bf0);
            Physical::~Physical(&local_1bf0);
            Physical::Physical(&local_1c88,&((this->super_Estimator).estimatorTime)->super_Physical)
            ;
            Matrix::setPhysical((Matrix *)local_1a70,0,&local_1c88);
            Physical::~Physical(&local_1c88);
            Physical::Physical((Physical *)&p_2.physicalUnit.nExpPrefix,
                               &((this->super_Estimator).pSource)->super_Physical);
            Matrix::setPhysical((Matrix *)local_1a70,1,(Physical *)&p_2.physicalUnit.nExpPrefix);
            Physical::~Physical((Physical *)&p_2.physicalUnit.nExpPrefix);
            Physical::Physical((Physical *)local_1db8);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1dd8,"probability",&local_1dd9);
            Physical::setDescription((Physical *)local_1db8,&local_1dd8);
            std::__cxx11::string::~string((string *)&local_1dd8);
            std::allocator<char>::~allocator(&local_1dd9);
            Physical::Physical((Physical *)&i_3,(Physical *)local_1db8);
            Matrix::setPhysical((Matrix *)local_1a70,2,(Physical *)&i_3);
            Physical::~Physical((Physical *)&i_3);
            Physical::~Physical((Physical *)local_1db8);
          }
          for (local_1e7c = 0; (ulong)local_1e7c < this->nDist; local_1e7c = local_1e7c + 1) {
            for (local_1e80 = 0; local_1e80 < this->nLength; local_1e80 = local_1e80 + 1) {
              dVar4 = ((this->super_Estimator).estimatorTime)->dt;
              uVar3 = (ulong)local_1e80;
              dVar5 = this->dDistScale;
              dVar1 = this->dDistOffset;
              Matrix::operator[](&local_2180,(Matrix *)local_1a70,local_1e80);
              Matrix::operator[](&local_2080,&local_2180,local_1e7c);
              Matrix::operator[](&local_1f80,&local_2080,0);
              Matrix::operator=(&local_1f80,dVar4 * (double)uVar3 * dVar5 + dVar1);
              Matrix::~Matrix(&local_1f80);
              Matrix::~Matrix(&local_2080);
              Matrix::~Matrix(&local_2180);
              dVar4 = this->aDist[local_1e80][local_1e7c] /
                      (double)a.super_Matrix.sMatrixName.field_2._8_8_;
              Matrix::operator[](&local_2480,(Matrix *)local_1a70,local_1e80);
              Matrix::operator[](&local_2380,&local_2480,local_1e7c);
              Matrix::operator[](&local_2280,&local_2380,1);
              Matrix::operator=(&local_2280,dVar4);
              Matrix::~Matrix(&local_2280);
              Matrix::~Matrix(&local_2380);
              Matrix::~Matrix(&local_2480);
            }
          }
          Matrix::Matrix(__return_storage_ptr__,(Matrix *)local_1a70);
          Graph::~Graph((Graph *)local_1a70);
        }
      }
      else {
        Graph::Graph((Graph *)local_10a8,this->nLength);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_10c8,"process variance",
                   (allocator<char> *)(name.field_2._M_local_buf + 0xf));
        Matrix::setName((Matrix *)local_10a8,&local_10c8);
        std::__cxx11::string::~string((string *)&local_10c8);
        std::allocator<char>::~allocator((allocator<char> *)(name.field_2._M_local_buf + 0xf));
        if ((this->super_Estimator).pSource != (StochasticProcess *)0x0) {
          pSVar2 = (this->super_Estimator).pSource;
          local_24e0 = (Physical *)0x0;
          if (pSVar2 != (StochasticProcess *)0x0) {
            local_24e0 = &pSVar2->super_Physical;
          }
          (*local_24e0->_vptr_Physical[10])(&unit.nExpPrefix);
          Unit::getName_abi_cxx11_((string *)local_10f0,(Unit *)&unit.nExpPrefix);
          Unit::~Unit((Unit *)&unit.nExpPrefix);
          pSVar2 = (this->super_Estimator).pSource;
          local_24f0 = (Physical *)0x0;
          if (pSVar2 != (StochasticProcess *)0x0) {
            local_24f0 = &pSVar2->super_Physical;
          }
          (*local_24f0->_vptr_Physical[10])(&p_1.physicalUnit.nExpPrefix);
          std::__cxx11::string::string((string *)&local_1278,(string *)local_10f0);
          u1 = &p_1.physicalUnit.nExpPrefix;
          operator*(&local_12e0,(Unit *)u1,(Unit *)u1);
          Physical::Physical((Physical *)local_1258,&local_1278,&local_12e0);
          Unit::~Unit(&local_12e0);
          std::__cxx11::string::~string((string *)&local_1278);
          Parametric::getName_abi_cxx11_
                    (&local_1380,&((this->super_Estimator).pSource)->super_Parametric);
          std::operator+(&local_1360,"variance of ",&local_1380);
          std::operator+(&local_1340,&local_1360," (");
          Parametric::getType_abi_cxx11_
                    (&local_13a0,&((this->super_Estimator).pSource)->super_Parametric);
          std::operator+(&local_1320,&local_1340,&local_13a0);
          std::operator+(&local_1300,&local_1320,")");
          Matrix::setName((Matrix *)local_10a8,&local_1300);
          std::__cxx11::string::~string((string *)&local_1300);
          std::__cxx11::string::~string((string *)&local_1320);
          std::__cxx11::string::~string((string *)&local_13a0);
          std::__cxx11::string::~string((string *)&local_1340);
          std::__cxx11::string::~string((string *)&local_1360);
          std::__cxx11::string::~string((string *)&local_1380);
          Physical::Physical(&local_1438,(Physical *)local_1258);
          Matrix::setPhysical((Matrix *)local_10a8,&local_1438);
          Physical::~Physical(&local_1438);
          Physical::Physical(&local_14d0,&((this->super_Estimator).estimatorTime)->super_Physical);
          Matrix::setPhysical((Matrix *)local_10a8,0,&local_14d0);
          Physical::~Physical(&local_14d0);
          Physical::Physical((Physical *)local_1568,(Physical *)local_1258);
          Matrix::setPhysical((Matrix *)local_10a8,1,(Physical *)local_1568);
          Physical::~Physical((Physical *)local_1568);
          Physical::~Physical((Physical *)local_1258);
          Unit::~Unit((Unit *)&p_1.physicalUnit.nExpPrefix);
          std::__cxx11::string::~string((string *)local_10f0);
        }
        for (local_156c = 0; local_156c < this->nLength; local_156c = local_156c + 1) {
          dVar4 = ((this->super_Estimator).estimatorTime)->dt;
          uVar3 = (ulong)local_156c;
          Matrix::operator[](&local_1770,(Matrix *)local_10a8,local_156c);
          Matrix::operator[](&local_1670,&local_1770,0);
          Matrix::operator=(&local_1670,dVar4 * (double)uVar3);
          Matrix::~Matrix(&local_1670);
          Matrix::~Matrix(&local_1770);
          dVar4 = this->aTwo[local_156c] / (double)a.super_Matrix.sMatrixName.field_2._8_8_;
          dVar5 = ((this->aOne[local_156c] / (double)a.super_Matrix.sMatrixName.field_2._8_8_) *
                  this->aOne[local_156c]) / (double)a.super_Matrix.sMatrixName.field_2._8_8_;
          Matrix::operator[]((Matrix *)((long)&a_3.super_Matrix.sMatrixName.field_2 + 8),
                             (Matrix *)local_10a8,local_156c);
          Matrix::operator[](&local_1870,(Matrix *)((long)&a_3.super_Matrix.sMatrixName.field_2 + 8)
                             ,1);
          Matrix::operator=(&local_1870,dVar4 - dVar5);
          Matrix::~Matrix(&local_1870);
          Matrix::~Matrix((Matrix *)((long)&a_3.super_Matrix.sMatrixName.field_2 + 8));
        }
        Matrix::Matrix(__return_storage_ptr__,(Matrix *)local_10a8);
        Graph::~Graph((Graph *)local_10a8);
      }
    }
    else {
      Graph::Graph((Graph *)local_8f0,this->nLength);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_910,"process mean",&local_911);
      Matrix::setName((Matrix *)local_8f0,&local_910);
      std::__cxx11::string::~string((string *)&local_910);
      std::allocator<char>::~allocator(&local_911);
      if ((this->super_Estimator).pSource != (StochasticProcess *)0x0) {
        Parametric::getName_abi_cxx11_
                  (&local_9b8,&((this->super_Estimator).pSource)->super_Parametric);
        std::operator+(&local_998,"mean of ",&local_9b8);
        std::operator+(&local_978,&local_998," (");
        Parametric::getType_abi_cxx11_
                  (&local_9d8,&((this->super_Estimator).pSource)->super_Parametric);
        std::operator+(&local_958,&local_978,&local_9d8);
        std::operator+(&local_938,&local_958,")");
        Matrix::setName((Matrix *)local_8f0,&local_938);
        std::__cxx11::string::~string((string *)&local_938);
        std::__cxx11::string::~string((string *)&local_958);
        std::__cxx11::string::~string((string *)&local_9d8);
        std::__cxx11::string::~string((string *)&local_978);
        std::__cxx11::string::~string((string *)&local_998);
        std::__cxx11::string::~string((string *)&local_9b8);
        Physical::Physical(&local_a70,&((this->super_Estimator).pSource)->super_Physical);
        Matrix::setPhysical((Matrix *)local_8f0,&local_a70);
        Physical::~Physical(&local_a70);
        Physical::Physical(&local_b08,&((this->super_Estimator).estimatorTime)->super_Physical);
        Matrix::setPhysical((Matrix *)local_8f0,0,&local_b08);
        Physical::~Physical(&local_b08);
        Physical::Physical((Physical *)local_ba0,&((this->super_Estimator).pSource)->super_Physical)
        ;
        Matrix::setPhysical((Matrix *)local_8f0,1,(Physical *)local_ba0);
        Physical::~Physical((Physical *)local_ba0);
      }
      for (local_ba4 = 0; local_ba4 < this->nLength; local_ba4 = local_ba4 + 1) {
        dVar4 = ((this->super_Estimator).estimatorTime)->dt;
        uVar3 = (ulong)local_ba4;
        Matrix::operator[](&local_da8,(Matrix *)local_8f0,local_ba4);
        Matrix::operator[](&local_ca8,&local_da8,0);
        Matrix::operator=(&local_ca8,dVar4 * (double)uVar3);
        Matrix::~Matrix(&local_ca8);
        Matrix::~Matrix(&local_da8);
        dVar4 = this->aOne[local_ba4] / (double)a.super_Matrix.sMatrixName.field_2._8_8_;
        Matrix::operator[]((Matrix *)((long)&a_2.super_Matrix.sMatrixName.field_2 + 8),
                           (Matrix *)local_8f0,local_ba4);
        Matrix::operator[](&local_ea8,(Matrix *)((long)&a_2.super_Matrix.sMatrixName.field_2 + 8),1)
        ;
        Matrix::operator=(&local_ea8,dVar4);
        Matrix::~Matrix(&local_ea8);
        Matrix::~Matrix((Matrix *)((long)&a_2.super_Matrix.sMatrixName.field_2 + 8));
      }
      Matrix::Matrix(__return_storage_ptr__,(Matrix *)local_8f0);
      Graph::~Graph((Graph *)local_8f0);
    }
  }
  else {
    Graph::Graph((Graph *)local_128,this->nLength);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_148,"process sample",&local_149);
    Matrix::setName((Matrix *)local_128,&local_148);
    std::__cxx11::string::~string((string *)&local_148);
    std::allocator<char>::~allocator(&local_149);
    if ((this->super_Estimator).pSource != (StochasticProcess *)0x0) {
      Parametric::getName_abi_cxx11_
                (&local_200,&((this->super_Estimator).pSource)->super_Parametric);
      std::operator+(&local_1e0,"sample of ",&local_200);
      std::operator+(&local_1c0,&local_1e0," (");
      Parametric::getType_abi_cxx11_
                (&local_220,&((this->super_Estimator).pSource)->super_Parametric);
      std::operator+(&local_1a0,&local_1c0,&local_220);
      std::operator+(&local_180,&local_1a0,")");
      Matrix::setName((Matrix *)local_128,&local_180);
      std::__cxx11::string::~string((string *)&local_180);
      std::__cxx11::string::~string((string *)&local_1a0);
      std::__cxx11::string::~string((string *)&local_220);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::__cxx11::string::~string((string *)&local_1e0);
      std::__cxx11::string::~string((string *)&local_200);
      Physical::Physical(&local_2b8,&((this->super_Estimator).pSource)->super_Physical);
      Matrix::setPhysical((Matrix *)local_128,&local_2b8);
      Physical::~Physical(&local_2b8);
      Physical::Physical(&local_350,&((this->super_Estimator).estimatorTime)->super_Physical);
      Matrix::setPhysical((Matrix *)local_128,0,&local_350);
      Physical::~Physical(&local_350);
      Physical::Physical((Physical *)local_3e8,&((this->super_Estimator).pSource)->super_Physical);
      Matrix::setPhysical((Matrix *)local_128,1,(Physical *)local_3e8);
      Physical::~Physical((Physical *)local_3e8);
    }
    for (local_3ec = 0; local_3ec < this->nLength; local_3ec = local_3ec + 1) {
      dVar4 = ((this->super_Estimator).estimatorTime)->dt;
      uVar3 = (ulong)local_3ec;
      Matrix::operator[](&local_5f0,(Matrix *)local_128,local_3ec);
      Matrix::operator[](&local_4f0,&local_5f0,0);
      Matrix::operator=(&local_4f0,dVar4 * (double)uVar3);
      Matrix::~Matrix(&local_4f0);
      Matrix::~Matrix(&local_5f0);
      dVar4 = this->aSample[local_3ec];
      Matrix::operator[]((Matrix *)((long)&a_1.super_Matrix.sMatrixName.field_2 + 8),
                         (Matrix *)local_128,local_3ec);
      Matrix::operator[](&local_6f0,(Matrix *)((long)&a_1.super_Matrix.sMatrixName.field_2 + 8),1);
      Matrix::operator=(&local_6f0,dVar4);
      Matrix::~Matrix(&local_6f0);
      Matrix::~Matrix((Matrix *)((long)&a_1.super_Matrix.sMatrixName.field_2 + 8));
    }
    Matrix::Matrix(__return_storage_ptr__,(Matrix *)local_128);
    Graph::~Graph((Graph *)local_128);
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix ProcessEstimator::getEstimate(const Property& p)
{
	double samples = nSamples? double(nSamples): 1.0;
	if(nEstimate & EST_DIFF)
		samples *= estimatorTime->dt;
	
	if(p & nEstimate & EST_SAMPLE) {
		Graph a(nLength);
		a.setName("process sample");
		if( pSource ) {
			a.setName( "sample of " + pSource->getName() + " (" + pSource->getType() + ")" );
			a.setPhysical(*pSource);
			a.setPhysical(0, *estimatorTime );
			a.setPhysical(1, *pSource);
		}
		for(uint i=0; i<nLength; i++) {
			a[i][0] = estimatorTime->dt * (double) i;
			a[i][1] = aSample[i];
		}
		return a;
	}
	else if(p & nEstimate & EST_MEAN) {
		Graph a(nLength);
		a.setName("process mean");
		if( pSource ) {
			a.setName( "mean of " + pSource->getName() + " (" + pSource->getType() + ")" );
			a.setPhysical(*pSource);
			a.setPhysical(0, *estimatorTime );
			a.setPhysical(1, *pSource);
		}
		for(uint i=0; i<nLength; i++) {
			a[i][0] = estimatorTime->dt * (double) i;
			a[i][1] = aOne[i] / samples;
		}
		return a;
	}
	else if(p & nEstimate & EST_VAR) {
		Graph a(nLength);
		a.setName("process variance");
		if( pSource ) {
			string name = ((Physical *)pSource)->getUnit().getName();
			Unit unit = ((Physical *)pSource)->getUnit();
			Physical p(name, unit*unit);
			a.setName( "variance of " + pSource->getName() + " (" + pSource->getType() + ")" );
			a.setPhysical(p);
			a.setPhysical(0, *estimatorTime );
			a.setPhysical(1, p);
		}
		for(uint i=0; i<nLength; i++) {
			a[i][0] = estimatorTime->dt * (double) i;
			a[i][1] = (aTwo[i]/samples - (aOne[i]/samples*aOne[i]/samples));
		}
		return a;
	}
	else if( p & nEstimate & EST_DENS ) {
		Graph a(nLength, nDist);
		a.setName("process density");
		if( pSource ) {
			a.setName( "density of " + pSource->getName() + " (" + pSource->getType() + ")" );
			a.setPhysical(*pSource);
			a.setPhysical(0, *estimatorTime );
			a.setPhysical(1, *pSource);
			Physical p;
			p.setDescription("probability");
			a.setPhysical(2, p );
		}
        for(uint j=0; j<nDist; j++)
			for( uint i=0; i<nLength; i++ ) {
			a[i][j][0] = (estimatorTime->dt * (double(i) * dDistScale) + dDistOffset);
				a[i][j][1] = aDist[i][j] / samples;
			}
		return a;
	}
	return Matrix();
}